

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SetPluginTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_SetPointerPluginTest_doublePointer_TestShell::createTest
          (TEST_SetPointerPluginTest_doublePointer_TestShell *this)

{
  TEST_SetPointerPluginTest_doublePointer_Test *this_00;
  
  this_00 = (TEST_SetPointerPluginTest_doublePointer_Test *)
            operator_new(0x28,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SetPluginTest.cpp"
                         ,0xa2);
  TEST_SetPointerPluginTest_doublePointer_Test::TEST_SetPointerPluginTest_doublePointer_Test
            (this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(SetPointerPluginTest, doublePointer)
{
    SetDoublePointerUtestShell *doubletst = new SetDoublePointerUtestShell();
    myRegistry_->addTest(doubletst);
    myRegistry_->runAllTests(*result_);

    CHECK(orig_double_ptr == &orig_double);
    LONGS_EQUAL(1, result_->getCheckCount());
    delete doubletst;
}